

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_sdiv(BtorSimBitVector *a,BtorSimBitVector *b)

{
  _Bool _Var1;
  BtorSimBitVector *a_00;
  int *in_RDI;
  BtorSimBitVector *neg_udiv;
  BtorSimBitVector *udiv;
  BtorSimBitVector *cond_b;
  BtorSimBitVector *cond_a;
  BtorSimBitVector *neg_b;
  BtorSimBitVector *neg_a;
  BtorSimBitVector *xor;
  BtorSimBitVector *sign_b;
  BtorSimBitVector *sign_a;
  BtorSimBitVector *not_a_and_b;
  BtorSimBitVector *not_a;
  BtorSimBitVector *res;
  BtorSimBitVector *in_stack_ffffffffffffff78;
  BtorSimBitVector *in_stack_ffffffffffffff80;
  BtorSimBitVector *in_stack_ffffffffffffff88;
  BtorSimBitVector *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  BtorSimBitVector *in_stack_ffffffffffffffa0;
  undefined8 local_18;
  
  if (*in_RDI == 1) {
    btorsim_bv_not(in_stack_ffffffffffffff80);
    btorsim_bv_and(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_18 = btorsim_bv_not(in_stack_ffffffffffffff80);
    btorsim_bv_free((BtorSimBitVector *)0x13b079);
    btorsim_bv_free((BtorSimBitVector *)0x13b083);
  }
  else {
    btorsim_bv_slice(in_stack_ffffffffffffffa0,(uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                     (uint32_t)in_stack_ffffffffffffff98);
    btorsim_bv_slice(in_stack_ffffffffffffffa0,(uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                     (uint32_t)in_stack_ffffffffffffff98);
    btorsim_bv_xor(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    btorsim_bv_neg(in_stack_ffffffffffffff90);
    btorsim_bv_neg(in_stack_ffffffffffffff90);
    _Var1 = btorsim_bv_is_true(in_stack_ffffffffffffff78);
    if (_Var1) {
      btorsim_bv_copy(in_stack_ffffffffffffff80);
    }
    else {
      btorsim_bv_copy(in_stack_ffffffffffffff80);
    }
    _Var1 = btorsim_bv_is_true(in_stack_ffffffffffffff78);
    if (_Var1) {
      a_00 = btorsim_bv_copy(in_stack_ffffffffffffff80);
    }
    else {
      a_00 = btorsim_bv_copy(in_stack_ffffffffffffff80);
    }
    btorsim_bv_udiv(a_00,in_stack_ffffffffffffff78);
    btorsim_bv_neg(in_stack_ffffffffffffff90);
    _Var1 = btorsim_bv_is_true(in_stack_ffffffffffffff78);
    if (_Var1) {
      local_18 = btorsim_bv_copy(a_00);
    }
    else {
      local_18 = btorsim_bv_copy(a_00);
    }
    btorsim_bv_free((BtorSimBitVector *)0x13b1e7);
    btorsim_bv_free((BtorSimBitVector *)0x13b1f1);
    btorsim_bv_free((BtorSimBitVector *)0x13b1fb);
    btorsim_bv_free((BtorSimBitVector *)0x13b205);
    btorsim_bv_free((BtorSimBitVector *)0x13b20f);
    btorsim_bv_free((BtorSimBitVector *)0x13b219);
    btorsim_bv_free((BtorSimBitVector *)0x13b223);
    btorsim_bv_free((BtorSimBitVector *)0x13b22d);
    btorsim_bv_free((BtorSimBitVector *)0x13b237);
  }
  return local_18;
}

Assistant:

BtorSimBitVector *
btorsim_bv_sdiv (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  BtorSimBitVector *res = 0, *not_a, *not_a_and_b, *sign_a, *sign_b, *xor;
  BtorSimBitVector *neg_a, *neg_b, *cond_a, *cond_b, *udiv, *neg_udiv;

  if (a->width == 1)
  {
    not_a       = btorsim_bv_not (a);
    not_a_and_b = btorsim_bv_and (not_a, b);
    res         = btorsim_bv_not (not_a_and_b);
    btorsim_bv_free (not_a);
    btorsim_bv_free (not_a_and_b);
  }
  else
  {
    sign_a   = btorsim_bv_slice (a, a->width - 1, a->width - 1);
    sign_b   = btorsim_bv_slice (b, b->width - 1, b->width - 1);
    xor      = btorsim_bv_xor (sign_a, sign_b);
    neg_a    = btorsim_bv_neg (a);
    neg_b    = btorsim_bv_neg (b);
    cond_a   = btorsim_bv_is_true (sign_a) ? btorsim_bv_copy (neg_a)
                                           : btorsim_bv_copy (a);
    cond_b   = btorsim_bv_is_true (sign_b) ? btorsim_bv_copy (neg_b)
                                           : btorsim_bv_copy (b);
    udiv     = btorsim_bv_udiv (cond_a, cond_b);
    neg_udiv = btorsim_bv_neg (udiv);
    res      = btorsim_bv_is_true (xor) ? btorsim_bv_copy (neg_udiv)
                                        : btorsim_bv_copy (udiv);
    btorsim_bv_free (sign_a);
    btorsim_bv_free (sign_b);
    btorsim_bv_free (xor);
    btorsim_bv_free (neg_a);
    btorsim_bv_free (neg_b);
    btorsim_bv_free (cond_a);
    btorsim_bv_free (cond_b);
    btorsim_bv_free (udiv);
    btorsim_bv_free (neg_udiv);
  }

  assert (res);
  assert (rem_bits_zero_dbg (res));

  return res;
}